

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

char * gzerror(gzFile file,int *errnum)

{
  char *local_30;
  gz_statep state;
  int *errnum_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local = (gzFile)0x0;
  }
  else if ((*file == 0x1c4f) || (*file == 0x79b1)) {
    if (errnum != (int *)0x0) {
      *errnum = *(int *)((long)file + 0x6c);
    }
    if (*(long *)((long)file + 0x70) == 0) {
      local_30 = "";
    }
    else {
      local_30 = *(char **)((long)file + 0x70);
    }
    file_local = local_30;
  }
  else {
    file_local = (gzFile)0x0;
  }
  return (char *)file_local;
}

Assistant:

const char * ZEXPORT gzerror(gzFile file, int *errnum)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->msg == NULL ? "" : state->msg;
}